

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  iterator iVar5;
  iterator iVar6;
  int __c;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  uint32 *oneof_case_array;
  OneofDescriptor *containing_oneof;
  FieldDescriptor *field;
  int i;
  uint32 *has_bits_indices;
  uint32 *has_bits;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  size_type in_stack_ffffffffffffffa8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffffb0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffffb8;
  DescriptorPool *in_stack_ffffffffffffffc0;
  FieldDescriptor *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int index;
  uint32 *puVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *has_bit_set;
  FieldDescriptor *field_00;
  Reflection *this_01;
  
  this_01 = in_RDI;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x404080);
  bVar1 = internal::ReflectionSchema::IsDefaultInstance(&in_RDI->schema_,(Message *)in_RSI);
  if (!bVar1) {
    bVar1 = internal::ReflectionSchema::HasHasbits(&in_RDI->schema_);
    if (bVar1) {
      this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)GetHasBits(in_RSI,(Message *)in_RDX);
    }
    else {
      this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)0x0;
    }
    puVar7 = (in_RDI->schema_).has_bit_indices_;
    has_bit_set = this_00;
    field_00 = in_RDX;
    Descriptor::field_count(in_RDI->descriptor_);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    for (index = 0; index <= in_RDI->last_non_weak_field_index_; index = index + 1) {
      in_stack_ffffffffffffffc8 = Descriptor::field(in_RDI->descriptor_,index);
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x404142);
      if (bVar1) {
        iVar2 = FieldSize(this_01,(Message *)in_RSI,field_00);
        if (0 < iVar2) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(this_00,(value_type *)in_RDX);
        }
      }
      else {
        in_stack_ffffffffffffffc0 =
             (DescriptorPool *)FieldDescriptor::containing_oneof(in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffc0 == (DescriptorPool *)0x0) {
          if (has_bit_set ==
              (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)0x0) {
            bVar1 = HasBit((Reflection *)field,(Message *)containing_oneof,
                           (FieldDescriptor *)oneof_case_array);
            if (bVar1) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back(this_00,(value_type *)in_RDX);
            }
          }
          else {
            bVar1 = anon_unknown_0::IsIndexInHasBitSet
                              ((uint32 *)has_bit_set,(uint32)((ulong)puVar7 >> 0x20));
            if (bVar1) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back(this_00,(value_type *)in_RDX);
            }
          }
        }
        else {
          uVar3 = (in_RDI->schema_).oneof_case_offset_;
          pcVar4 = (char *)(ulong)uVar3;
          in_stack_ffffffffffffff78 =
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)anon_unknown_0::GetConstPointerAtOffset<unsigned_int>((Message *)in_RSI,uVar3);
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff78;
          pcVar4 = OneofDescriptor::index((OneofDescriptor *)in_stack_ffffffffffffffc0,pcVar4,__c);
          in_stack_ffffffffffffff84 =
               *(uint *)((long)&(in_stack_ffffffffffffff78->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start + (long)(int)pcVar4 * 4);
          uVar3 = FieldDescriptor::number(in_stack_ffffffffffffffc8);
          if (in_stack_ffffffffffffff84 == uVar3) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back(this_00,(value_type *)in_RDX);
          }
        }
      }
    }
    bVar1 = internal::ReflectionSchema::HasExtensionSet(&in_RDI->schema_);
    if (bVar1) {
      GetExtensionSet((Reflection *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (Message *)in_stack_ffffffffffffff78);
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)CONCAT44(index,in_stack_ffffffffffffffd0),
                 (Descriptor *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
    }
    iVar5 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::begin(in_stack_ffffffffffffff78);
    iVar6 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(in_stack_ffffffffffffff78);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
              (iVar5._M_current,iVar6._M_current);
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        const uint32* const oneof_case_array = GetConstPointerAtOffset<uint32>(
            &message, schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}